

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void __thiscall rw::MatFX::setEnvTexture(MatFX *this,Texture *t)

{
  int32 iVar1;
  int32 i;
  Texture *t_local;
  MatFX *this_local;
  
  iVar1 = getEffectIndex(this,2);
  if (-1 < iVar1) {
    if (this->fx[iVar1].field_1.bump.bumpedTex != (Texture *)0x0) {
      Texture::destroy(this->fx[iVar1].field_1.bump.bumpedTex);
    }
    this->fx[iVar1].field_1.bump.bumpedTex = t;
    if (t != (Texture *)0x0) {
      Texture::addRef(t);
    }
  }
  return;
}

Assistant:

void
MatFX::setEnvTexture(Texture *t)
{
	int32 i = this->getEffectIndex(ENVMAP);
	if(i >= 0){
		if(this->fx[i].env.tex)
			this->fx[i].env.tex->destroy();
		this->fx[i].env.tex = t;
		if(t)
			t->addRef();
	}
}